

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

void __thiscall
testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::PerAEADTest>::RegisterTests
          (ParameterizedTestSuiteInfo<(anonymous_namespace)::PerAEADTest> *this)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  __shared_ptr_access<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::PerAEADTest>::TestInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *this_00;
  reference pIVar5;
  ulong uVar6;
  ostream *poVar7;
  size_type sVar8;
  void *this_01;
  char *pcVar9;
  char *value_param;
  element_type *peVar10;
  undefined4 extraout_var;
  SetUpTearDownSuiteFuncType set_up_tc;
  SetUpTearDownSuiteFuncType tear_down_tc;
  pointer pTVar11;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar12;
  CodeLocation local_2a0;
  undefined8 local_278;
  undefined8 uStack_270;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 local_258;
  undefined8 uStack_250;
  undefined8 local_248;
  undefined8 uStack_240;
  CodeLocation local_238;
  string local_210;
  string local_1f0;
  _Base_ptr local_1d0;
  undefined1 local_1c8;
  GTestLog local_1c0;
  GTestLog local_1bc;
  TestParamInfo<(anonymous_namespace)::KnownAEAD> local_1b8;
  undefined1 local_170 [8];
  string param_name;
  KnownAEAD *param;
  iterator __end0_2;
  iterator __begin0_2;
  ParamGenerator<(anonymous_namespace)::KnownAEAD> *__range5;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  test_param_names;
  size_t i;
  int local_d4;
  char *pcStack_d0;
  int line;
  char *file;
  ParamNameGeneratorFunc *name_func;
  undefined1 local_b0 [8];
  ParamGenerator<(anonymous_namespace)::KnownAEAD> generator;
  string *instantiation_name;
  InstantiationInfo *instantiation;
  iterator __end0_1;
  iterator __begin0_1;
  InstantiationContainer *__range4;
  shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::PerAEADTest>::TestInfo>
  *test_info;
  iterator __end0;
  iterator __begin0;
  TestInfoContainer *__range3;
  string test_name;
  string test_suite_name;
  bool generated_instantiations;
  ParameterizedTestSuiteInfo<(anonymous_namespace)::PerAEADTest> *this_local;
  
  bVar2 = false;
  std::__cxx11::string::string((string *)(test_name.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)&__range3);
  __end0 = std::
           vector<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::PerAEADTest>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::PerAEADTest>::TestInfo>_>_>
           ::begin(&this->tests_);
  test_info = (shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::PerAEADTest>::TestInfo>
               *)std::
                 vector<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::PerAEADTest>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::PerAEADTest>::TestInfo>_>_>
                 ::end(&this->tests_);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end0,(__normal_iterator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::PerAEADTest>::TestInfo>_*,_std::vector<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::PerAEADTest>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::PerAEADTest>::TestInfo>_>_>_>
                                     *)&test_info), bVar1) {
    this_00 = (__shared_ptr_access<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::PerAEADTest>::TestInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               *)__gnu_cxx::
                 __normal_iterator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::PerAEADTest>::TestInfo>_*,_std::vector<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::PerAEADTest>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::PerAEADTest>::TestInfo>_>_>_>
                 ::operator*(&__end0);
    __end0_1 = std::
               vector<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::PerAEADTest>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::PerAEADTest>::InstantiationInfo>_>
               ::begin(&this->instantiations_);
    instantiation =
         (InstantiationInfo *)
         std::
         vector<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::PerAEADTest>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::PerAEADTest>::InstantiationInfo>_>
         ::end(&this->instantiations_);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end0_1,
                              (__normal_iterator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::PerAEADTest>::InstantiationInfo_*,_std::vector<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::PerAEADTest>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::PerAEADTest>::InstantiationInfo>_>_>
                               *)&instantiation), bVar1) {
      pIVar5 = __gnu_cxx::
               __normal_iterator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::PerAEADTest>::InstantiationInfo_*,_std::vector<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::PerAEADTest>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::PerAEADTest>::InstantiationInfo>_>_>
               ::operator*(&__end0_1);
      generator.impl_.
      super___shared_ptr<const_testing::internal::ParamGeneratorInterface<(anonymous_namespace)::KnownAEAD>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pIVar5;
      (*pIVar5->generator)(local_b0);
      file = (char *)pIVar5->name_func;
      pcStack_d0 = pIVar5->file;
      local_d4 = pIVar5->line;
      uVar6 = std::__cxx11::string::empty();
      if ((uVar6 & 1) == 0) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&i,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       generator.impl_.
                       super___shared_ptr<const_testing::internal::ParamGeneratorInterface<(anonymous_namespace)::KnownAEAD>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi,"/");
        std::__cxx11::string::operator=((string *)(test_name.field_2._M_local_buf + 8),(string *)&i)
        ;
        std::__cxx11::string::~string((string *)&i);
      }
      else {
        std::__cxx11::string::clear();
      }
      std::__cxx11::string::operator+=
                ((string *)(test_name.field_2._M_local_buf + 8),(string *)&this->test_suite_name_);
      test_param_names._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&__range5);
      ParamGenerator<(anonymous_namespace)::KnownAEAD>::begin
                ((ParamGenerator<(anonymous_namespace)::KnownAEAD> *)&__end0_2);
      ParamGenerator<(anonymous_namespace)::KnownAEAD>::end
                ((ParamGenerator<(anonymous_namespace)::KnownAEAD> *)&param);
      while (bVar1 = ParamIterator<(anonymous_namespace)::KnownAEAD>::operator!=
                               (&__end0_2,(ParamIterator<(anonymous_namespace)::KnownAEAD> *)&param)
            , bVar1) {
        param_name.field_2._8_8_ =
             ParamIterator<(anonymous_namespace)::KnownAEAD>::operator*(&__end0_2);
        bVar2 = true;
        std::__cxx11::string::clear();
        pcVar9 = file;
        TestParamInfo<(anonymous_namespace)::KnownAEAD>::TestParamInfo
                  (&local_1b8,(KnownAEAD *)param_name.field_2._8_8_,
                   test_param_names._M_t._M_impl.super__Rb_tree_header._M_node_count);
        (*(code *)pcVar9)(local_170,&local_1b8);
        bVar1 = IsValidParamName((string *)local_170);
        bVar1 = IsTrue(bVar1);
        if (!bVar1) {
          GTestLog::GTestLog(&local_1bc,GTEST_FATAL,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/third_party/googletest/googletest/include/gtest/internal/gtest-param-util.h"
                             ,0x247);
          poVar7 = GTestLog::GetStream(&local_1bc);
          poVar7 = std::operator<<(poVar7,"Condition IsValidParamName(param_name) failed. ");
          poVar7 = std::operator<<(poVar7,"Parameterized test name \'");
          poVar7 = std::operator<<(poVar7,(string *)local_170);
          poVar7 = std::operator<<(poVar7,
                                   "\' is invalid (contains spaces, dashes, or any non-alphanumeric characters other than underscores), in "
                                  );
          poVar7 = std::operator<<(poVar7,pcStack_d0);
          poVar7 = std::operator<<(poVar7," line ");
          poVar7 = (ostream *)std::ostream::operator<<(poVar7,local_d4);
          poVar7 = std::operator<<(poVar7,"");
          std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
          GTestLog::~GTestLog(&local_1bc);
        }
        sVar8 = std::
                set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&__range5,(key_type *)local_170);
        bVar1 = IsTrue(sVar8 == 0);
        if (!bVar1) {
          GTestLog::GTestLog(&local_1c0,GTEST_FATAL,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/third_party/googletest/googletest/include/gtest/internal/gtest-param-util.h"
                             ,0x24d);
          poVar7 = GTestLog::GetStream(&local_1c0);
          poVar7 = std::operator<<(poVar7,
                                   "Condition test_param_names.count(param_name) == 0 failed. ");
          poVar7 = std::operator<<(poVar7,"Duplicate parameterized test name \'");
          poVar7 = std::operator<<(poVar7,(string *)local_170);
          poVar7 = std::operator<<(poVar7,"\', in ");
          poVar7 = std::operator<<(poVar7,pcStack_d0);
          poVar7 = std::operator<<(poVar7," line ");
          this_01 = (void *)std::ostream::operator<<(poVar7,local_d4);
          std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
          GTestLog::~GTestLog(&local_1c0);
        }
        std::
        __shared_ptr_access<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::PerAEADTest>::TestInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->(this_00);
        uVar6 = std::__cxx11::string::empty();
        if ((uVar6 & 1) == 0) {
          std::
          __shared_ptr_access<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::PerAEADTest>::TestInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
          ::operator->(this_00);
          pcVar9 = (char *)std::__cxx11::string::append((string *)&__range3);
          std::__cxx11::string::append(pcVar9);
        }
        std::__cxx11::string::operator+=((string *)&__range3,(string *)local_170);
        pVar12 = std::
                 set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&__range5,(value_type *)local_170);
        local_1d0 = (_Base_ptr)pVar12.first._M_node;
        local_1c8 = pVar12.second;
        std::__cxx11::string::string
                  ((string *)&local_1f0,(string *)(test_name.field_2._M_local_buf + 8));
        pcVar9 = (char *)std::__cxx11::string::c_str();
        PrintToString<(anonymous_namespace)::KnownAEAD>
                  (&local_210,(KnownAEAD *)param_name.field_2._8_8_);
        value_param = (char *)std::__cxx11::string::c_str();
        peVar10 = std::
                  __shared_ptr_access<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::PerAEADTest>::TestInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->(this_00);
        CodeLocation::CodeLocation(&local_238,&peVar10->code_location);
        iVar4 = (*(this->super_ParameterizedTestSuiteInfoBase)._vptr_ParameterizedTestSuiteInfoBase
                  [3])();
        set_up_tc = SuiteApiResolver<(anonymous_namespace)::PerAEADTest>::GetSetUpCaseOrSuite
                              (pcStack_d0,local_d4);
        tear_down_tc = SuiteApiResolver<(anonymous_namespace)::PerAEADTest>::GetTearDownCaseOrSuite
                                 (pcStack_d0,local_d4);
        peVar10 = std::
                  __shared_ptr_access<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::PerAEADTest>::TestInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->(this_00);
        pTVar11 = std::
                  unique_ptr<testing::internal::TestMetaFactoryBase<(anonymous_namespace)::KnownAEAD>,_std::default_delete<testing::internal::TestMetaFactoryBase<(anonymous_namespace)::KnownAEAD>_>_>
                  ::operator->(&peVar10->test_meta_factory);
        local_278 = *(undefined8 *)param_name.field_2._8_8_;
        uStack_270 = *(undefined8 *)(param_name.field_2._8_8_ + 8);
        local_268 = *(undefined8 *)(param_name.field_2._8_8_ + 0x10);
        uStack_260 = *(undefined8 *)(param_name.field_2._8_8_ + 0x18);
        local_258 = *(undefined8 *)(param_name.field_2._8_8_ + 0x20);
        uStack_250 = *(undefined8 *)(param_name.field_2._8_8_ + 0x28);
        local_248 = *(undefined8 *)(param_name.field_2._8_8_ + 0x30);
        uStack_240 = *(undefined8 *)(param_name.field_2._8_8_ + 0x38);
        iVar3 = (*pTVar11->_vptr_TestMetaFactoryBase[2])();
        MakeAndRegisterTestInfo
                  (&local_1f0,pcVar9,(char *)0x0,value_param,&local_238,
                   (TypeId)CONCAT44(extraout_var,iVar4),set_up_tc,tear_down_tc,
                   (TestFactoryBase *)CONCAT44(extraout_var_00,iVar3));
        CodeLocation::~CodeLocation(&local_238);
        std::__cxx11::string::~string((string *)&local_210);
        std::__cxx11::string::~string((string *)&local_1f0);
        test_param_names._M_t._M_impl.super__Rb_tree_header._M_node_count =
             test_param_names._M_t._M_impl.super__Rb_tree_header._M_node_count + 1;
        std::__cxx11::string::~string((string *)local_170);
        ParamIterator<(anonymous_namespace)::KnownAEAD>::operator++(&__end0_2);
      }
      ParamIterator<(anonymous_namespace)::KnownAEAD>::~ParamIterator
                ((ParamIterator<(anonymous_namespace)::KnownAEAD> *)&param);
      ParamIterator<(anonymous_namespace)::KnownAEAD>::~ParamIterator(&__end0_2);
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&__range5);
      ParamGenerator<(anonymous_namespace)::KnownAEAD>::~ParamGenerator
                ((ParamGenerator<(anonymous_namespace)::KnownAEAD> *)local_b0);
      __gnu_cxx::
      __normal_iterator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::PerAEADTest>::InstantiationInfo_*,_std::vector<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::PerAEADTest>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::PerAEADTest>::InstantiationInfo>_>_>
      ::operator++(&__end0_1);
    }
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::PerAEADTest>::TestInfo>_*,_std::vector<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::PerAEADTest>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::PerAEADTest>::TestInfo>_>_>_>
    ::operator++(&__end0);
  }
  if (!bVar2) {
    iVar4 = (*(this->super_ParameterizedTestSuiteInfoBase)._vptr_ParameterizedTestSuiteInfoBase[2])
                      ();
    CodeLocation::CodeLocation(&local_2a0,&this->code_location_);
    bVar2 = std::
            vector<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::PerAEADTest>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::PerAEADTest>::TestInfo>_>_>
            ::empty(&this->tests_);
    InsertSyntheticTestCase((string *)CONCAT44(extraout_var_01,iVar4),&local_2a0,!bVar2);
    CodeLocation::~CodeLocation(&local_2a0);
  }
  std::__cxx11::string::~string((string *)&__range3);
  std::__cxx11::string::~string((string *)(test_name.field_2._M_local_buf + 8));
  return;
}

Assistant:

void RegisterTests() override {
    bool generated_instantiations = false;

    std::string test_suite_name;
    std::string test_name;
    for (const std::shared_ptr<TestInfo>& test_info : tests_) {
      for (const InstantiationInfo& instantiation : instantiations_) {
        const std::string& instantiation_name = instantiation.name;
        ParamGenerator<ParamType> generator((*instantiation.generator)());
        ParamNameGeneratorFunc* name_func = instantiation.name_func;
        const char* file = instantiation.file;
        int line = instantiation.line;

        if (!instantiation_name.empty())
          test_suite_name = instantiation_name + "/";
        else
          test_suite_name.clear();
        test_suite_name += test_suite_name_;

        size_t i = 0;
        std::set<std::string> test_param_names;
        for (const auto& param : generator) {
          generated_instantiations = true;

          test_name.clear();

          std::string param_name =
              name_func(TestParamInfo<ParamType>(param, i));

          GTEST_CHECK_(IsValidParamName(param_name))
              << "Parameterized test name '" << param_name
              << "' is invalid (contains spaces, dashes, or any "
                 "non-alphanumeric characters other than underscores), in "
              << file << " line " << line << "" << std::endl;

          GTEST_CHECK_(test_param_names.count(param_name) == 0)
              << "Duplicate parameterized test name '" << param_name << "', in "
              << file << " line " << line << std::endl;

          if (!test_info->test_base_name.empty()) {
            test_name.append(test_info->test_base_name).append("/");
          }
          test_name += param_name;

          test_param_names.insert(std::move(param_name));

          MakeAndRegisterTestInfo(
              test_suite_name, test_name.c_str(),
              nullptr,  // No type parameter.
              PrintToString(param).c_str(), test_info->code_location,
              GetTestSuiteTypeId(),
              SuiteApiResolver<TestSuite>::GetSetUpCaseOrSuite(file, line),
              SuiteApiResolver<TestSuite>::GetTearDownCaseOrSuite(file, line),
              test_info->test_meta_factory->CreateTestFactory(param));
          ++i;
        }  // for param
      }  // for instantiation
    }  // for test_info

    if (!generated_instantiations) {
      // There are no generaotrs, or they all generate nothing ...
      InsertSyntheticTestCase(GetTestSuiteName(), code_location_,
                              !tests_.empty());
    }
  }